

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O2

void __thiscall SceneRender::renderBackground(SceneRender *this,Uniforms *_uniforms)

{
  TextureCube *pTVar1;
  int iVar2;
  Vbo *pVVar3;
  Vbo *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *this_01;
  Shader *pSVar4;
  allocator local_129;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_128;
  undefined8 local_124;
  undefined8 uStack_11c;
  undefined4 local_114;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined4 local_100;
  undefined8 local_fc;
  undefined8 uStack_f4;
  undefined4 local_ec;
  string local_e8;
  mat4 ori;
  
  if (this->m_background == true) {
    if ((_uniforms->tracker).m_running == true) {
      std::__cxx11::string::string((string *)&ori,"render:scene:background",(allocator *)&local_128)
      ;
      Tracker::begin(&_uniforms->tracker,(string *)&ori);
      std::__cxx11::string::~string((string *)&ori);
    }
    glDisable(0xb71);
    pSVar4 = &this->m_background_shader;
    vera::Shader::use(pSVar4);
    std::__cxx11::string::string((string *)&local_128,"u_modelMatrix",(allocator *)&local_e8);
    ori.value[0].field_0.x = 1.0;
    ori.value[0].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    ori.value[0].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    ori.value[0].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    ori.value[1].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    ori.value[1].field_1.y = 1.0;
    ori.value[1].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    ori.value[1].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    ori.value[2].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    ori.value[2].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    ori.value[2].field_2.z = 1.0;
    ori.value[2].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    ori.value[3].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    ori.value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    ori.value[3].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    ori.value[3].field_3.w = 1.0;
    vera::Shader::setUniform(pSVar4,(string *)&local_128,&ori,false);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::string((string *)&local_128,"u_viewMatrix",(allocator *)&local_e8);
    ori.value[0].field_0.x = 1.0;
    ori.value[0].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    ori.value[0].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    ori.value[0].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    ori.value[1].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    ori.value[1].field_1.y = 1.0;
    ori.value[1].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    ori.value[1].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    ori.value[2].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    ori.value[2].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    ori.value[2].field_2.z = 1.0;
    ori.value[2].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    ori.value[3].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    ori.value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    ori.value[3].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    ori.value[3].field_3.w = 1.0;
    vera::Shader::setUniform(pSVar4,(string *)&local_128,&ori,false);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::string((string *)&local_128,"u_projectionMatrix",(allocator *)&local_e8);
    ori.value[0].field_0.x = 1.0;
    ori.value[0].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    ori.value[0].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    ori.value[0].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    ori.value[1].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    ori.value[1].field_1.y = 1.0;
    ori.value[1].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    ori.value[1].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    ori.value[2].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    ori.value[2].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    ori.value[2].field_2.z = 1.0;
    ori.value[2].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    ori.value[3].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    ori.value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    ori.value[3].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    ori.value[3].field_3.w = 1.0;
    vera::Shader::setUniform(pSVar4,(string *)&local_128,&ori,false);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::string
              ((string *)&local_128,"u_modelViewProjectionMatrix",(allocator *)&local_e8);
    ori.value[0].field_0.x = 1.0;
    ori.value[0].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    ori.value[0].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    ori.value[0].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    ori.value[1].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    ori.value[1].field_1.y = 1.0;
    ori.value[1].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    ori.value[1].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    ori.value[2].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    ori.value[2].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    ori.value[2].field_2.z = 1.0;
    ori.value[2].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    ori.value[3].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    ori.value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    ori.value[3].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    ori.value[3].field_3.w = 1.0;
    vera::Shader::setUniform(pSVar4,(string *)&local_128,&ori,false);
    std::__cxx11::string::~string((string *)&local_128);
    (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar4,1);
    pVVar3 = vera::getBillboard();
    vera::Vbo::render(pVVar3,pSVar4);
    if ((_uniforms->tracker).m_running != true) {
      return;
    }
    std::__cxx11::string::string((string *)&ori,"render:scene:background",(allocator *)&local_128);
    Tracker::end(&_uniforms->tracker,(string *)&ori);
    this_01 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *)&ori;
  }
  else {
    pTVar1 = (_uniforms->super_Scene).activeCubemap;
    if (pTVar1 == (TextureCube *)0x0) {
      return;
    }
    if (this->showCubebox != true) {
      return;
    }
    iVar2 = (*(pTVar1->super_Texture)._vptr_Texture[9])();
    if ((char)iVar2 == '\0') {
      return;
    }
    if ((_uniforms->tracker).m_running == true) {
      std::__cxx11::string::string((string *)&ori,"render:scene:cubemap",(allocator *)&local_128);
      Tracker::begin(&_uniforms->tracker,(string *)&ori);
      std::__cxx11::string::~string((string *)&ori);
    }
    glDisable(0xb71);
    if ((this->m_cubemap_vbo)._M_t.super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>
        ._M_t.super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
        super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl == (Vbo *)0x0) {
      this_00 = (Vbo *)operator_new(0x60);
      vera::cubeMesh((Mesh *)&ori,1.0);
      vera::Vbo::Vbo(this_00,(Mesh *)&ori);
      pVVar3 = (this->m_cubemap_vbo)._M_t.
               super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>._M_t.
               super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
               super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl;
      (this->m_cubemap_vbo)._M_t.super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>.
      _M_t.super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
      super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl = this_00;
      if (pVVar3 != (Vbo *)0x0) {
        (*pVVar3->_vptr_Vbo[1])();
      }
      vera::Mesh::~Mesh((Mesh *)&ori);
    }
    (*(((_uniforms->super_Scene).activeCamera)->super_Node)._vptr_Node[0x1c])(&ori);
    pSVar4 = &this->m_cubemap_shader;
    vera::Shader::use(pSVar4);
    std::__cxx11::string::string((string *)&local_e8,"u_modelViewProjectionMatrix",&local_129);
    iVar2 = (*(((_uniforms->super_Scene).activeCamera)->super_Node)._vptr_Node[0x59])();
    glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)&local_128,
                   (mat<4,_4,_float,_(glm::qualifier)0> *)CONCAT44(extraout_var,iVar2),&ori);
    vera::Shader::setUniform(pSVar4,&local_e8,(mat4 *)&local_128,false);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::string((string *)&local_e8,"u_modelMatrix",&local_129);
    local_128.x = 1.0;
    local_124 = 0;
    uStack_11c = 0;
    local_114 = 0x3f800000;
    local_110 = 0;
    uStack_108 = 0;
    local_100 = 0x3f800000;
    local_fc = 0;
    uStack_f4 = 0;
    local_ec = 0x3f800000;
    vera::Shader::setUniform(pSVar4,&local_e8,(mat4 *)&local_128,false);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::string((string *)&local_128,"u_viewMatrix",(allocator *)&local_e8);
    vera::Shader::setUniform(pSVar4,(string *)&local_128,&ori,false);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::string((string *)&local_128,"u_projectionMatrix",(allocator *)&local_e8);
    iVar2 = (*(((_uniforms->super_Scene).activeCamera)->super_Node)._vptr_Node[0x59])();
    vera::Shader::setUniform
              (pSVar4,(string *)&local_128,(mat4 *)CONCAT44(extraout_var_00,iVar2),false);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::string((string *)&local_128,"u_cubeMap",(allocator *)&local_e8);
    vera::Shader::setUniformTextureCube
              (pSVar4,(string *)&local_128,(_uniforms->super_Scene).activeCubemap,0);
    std::__cxx11::string::~string((string *)&local_128);
    vera::Vbo::render((this->m_cubemap_vbo)._M_t.
                      super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>._M_t.
                      super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
                      super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl,pSVar4);
    if ((_uniforms->tracker).m_running != true) {
      return;
    }
    std::__cxx11::string::string((string *)&local_128,"render:scene:cubemap",(allocator *)&local_e8)
    ;
    Tracker::end(&_uniforms->tracker,(string *)&local_128);
    this_01 = &local_128;
  }
  std::__cxx11::string::~string((string *)this_01);
  return;
}

Assistant:

void SceneRender::renderBackground(Uniforms& _uniforms) {
    if (m_background) {
        TRACK_BEGIN("render:scene:background")
        glDisable(GL_DEPTH_TEST);

        m_background_shader.use();
        m_background_shader.setUniform("u_modelMatrix", glm::mat4(1.0));
        m_background_shader.setUniform("u_viewMatrix", glm::mat4(1.0));
        m_background_shader.setUniform("u_projectionMatrix", glm::mat4(1.0));
        m_background_shader.setUniform("u_modelViewProjectionMatrix", glm::mat4(1.0));

        // Update Uniforms and textures
        _uniforms.feedTo( &m_background_shader );

        vera::getBillboard()->render( &m_background_shader );

        TRACK_END("render:scene:background")
    }

    else if (_uniforms.activeCubemap) {
        if (showCubebox && _uniforms.activeCubemap->loaded()) {
            TRACK_BEGIN("render:scene:cubemap")

            glDisable(GL_DEPTH_TEST);

            if (!m_cubemap_vbo)
                m_cubemap_vbo = std::unique_ptr<vera::Vbo>(new vera::Vbo( vera::cubeMesh(1.0f) ));

            glm::mat4 ori = _uniforms.activeCamera->getOrientationMatrix();

            #if defined(__EMSCRIPTEN__)
            if (vera::getXR() == vera::VR_MODE)
                ori = glm::inverse(ori);
            #endif

            m_cubemap_shader.use();
            m_cubemap_shader.setUniform("u_modelViewProjectionMatrix", _uniforms.activeCamera->getProjectionMatrix() * ori);
            m_cubemap_shader.setUniform("u_modelMatrix", glm::mat4(1.0));
            m_cubemap_shader.setUniform("u_viewMatrix", ori);
            m_cubemap_shader.setUniform("u_projectionMatrix", _uniforms.activeCamera->getProjectionMatrix());
            m_cubemap_shader.setUniformTextureCube("u_cubeMap", _uniforms.activeCubemap, 0);
            m_cubemap_vbo->render(&m_cubemap_shader);

            TRACK_END("render:scene:cubemap")
        }
    }
}